

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O2

void __thiscall
OpenMD::MolecularRestraint::setReferenceStructure
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *ref,
          Vector3d *refCom)

{
  pointer pVVar1;
  Vector<double,_3U> *v1;
  long lVar2;
  Vector<double,_3U> VStack_48;
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
            (&this->ref_,ref);
  Vector<double,_3U>::operator=
            (&(this->refCom_).super_Vector<double,_3U>,&refCom->super_Vector<double,_3U>);
  v1 = &((this->ref_).
         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>;
  lVar2 = -(long)v1;
  for (; v1 != &((this->ref_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->super_Vector<double,_3U>; v1 = v1 + 1)
  {
    operator-(&VStack_48,v1,&(this->refCom_).super_Vector<double,_3U>);
    Vector3<double>::operator=((Vector3<double> *)v1,&VStack_48);
    lVar2 = lVar2 + -0x18;
  }
  pVVar1 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->forces_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar1) {
    (this->forces_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->forces_,
             -((long)(((this->ref_).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_ +
              lVar2) / 0x18);
  return;
}

Assistant:

void setReferenceStructure(std::vector<Vector3d> ref, Vector3d refCom) {
      ref_    = ref;
      refCom_ = refCom;

      std::vector<Vector3d>::iterator i;

      for (i = ref_.begin(); i != ref_.end(); ++i) {
        (*i) = (*i) - refCom_;
      }

      forces_.clear();
      forces_.resize(ref_.size());
    }